

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O0

void __thiscall
MetadataMultilayerEncodeTest_Test_Test::MetadataMultilayerEncodeTest_Test_Test
          (MetadataMultilayerEncodeTest_Test_Test *this)

{
  undefined8 *in_RDI;
  
  anon_unknown.dwarf_12f2301::MetadataMultilayerEncodeTest::MetadataMultilayerEncodeTest
            (&this->super_MetadataMultilayerEncodeTest);
  *in_RDI = &PTR__MetadataMultilayerEncodeTest_Test_Test_01fa8ca0;
  in_RDI[2] = &PTR__MetadataMultilayerEncodeTest_Test_Test_01fa8d00;
  in_RDI[3] = &PTR__MetadataMultilayerEncodeTest_Test_Test_01fa8d20;
  return;
}

Assistant:

TEST_P(MetadataMultilayerEncodeTest, Test) {
  cfg_.rc_buf_initial_sz = 500;
  cfg_.rc_buf_optimal_sz = 500;
  cfg_.rc_buf_sz = 1000;
  cfg_.g_lag_in_frames = 0;
  cfg_.g_error_resilient = 0;
  cfg_.rc_target_bitrate = 1200;

  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, /*limit=*/10);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}